

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O2

int __thiscall
IlmThread_2_5::anon_unknown_5::DefaultThreadPoolProvider::numThreads
          (DefaultThreadPoolProvider *this)

{
  pointer ppDVar1;
  pointer ppDVar2;
  Lock local_28;
  
  local_28._mutex = &(this->_data).threadMutex;
  std::mutex::lock(local_28._mutex);
  local_28._locked = true;
  ppDVar1 = (this->_data).threads.
            super__Vector_base<IlmThread_2_5::(anonymous_namespace)::DefaultWorkerThread_*,_std::allocator<IlmThread_2_5::(anonymous_namespace)::DefaultWorkerThread_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppDVar2 = (this->_data).threads.
            super__Vector_base<IlmThread_2_5::(anonymous_namespace)::DefaultWorkerThread_*,_std::allocator<IlmThread_2_5::(anonymous_namespace)::DefaultWorkerThread_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  Lock::~Lock(&local_28);
  return (int)((ulong)((long)ppDVar1 - (long)ppDVar2) >> 3);
}

Assistant:

int
DefaultThreadPoolProvider::numThreads () const
{
    Lock lock (_data.threadMutex);
    return static_cast<int> (_data.threads.size());
}